

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O2

boolean lib_dlb_fopen(dlb *dp,char *name,char *mode)

{
  long *plVar1;
  libdir *plVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  for (lVar6 = 0; (lVar6 != 4 && (dlb_libs[lVar6].fdata != (FILE *)0x0)); lVar6 = lVar6 + 1) {
    lVar7 = dlb_libs[lVar6].nentries;
    if (dlb_libs[lVar6].nentries < 1) {
      lVar7 = 0;
    }
    lVar7 = lVar7 + 1;
    lVar3 = 0;
    while (lVar5 = lVar3, lVar7 = lVar7 + -1, lVar7 != 0) {
      plVar2 = dlb_libs[lVar6].dir;
      iVar4 = strcmp(name,*(char **)((long)&plVar2->fname + lVar5));
      lVar3 = lVar5 + 0x20;
      if (iVar4 == 0) {
        dp->lib = dlb_libs + lVar6;
        plVar1 = (long *)((long)&plVar2->foffset + lVar5);
        lVar6 = plVar1[1];
        dp->start = *plVar1;
        dp->size = lVar6;
        dp->mark = 0;
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

static boolean lib_dlb_fopen(dlb *dp, const char *name, const char *mode)
{
    long start, size;
    library *lp;

    /* look up file in directory */
    if (find_file(name, &lp, &start, &size)) {
	dp->lib = lp;
	dp->start = start;
	dp->size = size;
	dp->mark = 0;
	return TRUE;
	}

    return FALSE;	/* failed */
}